

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHie.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkFlattenLogicHierarchy2(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  Abc_Ntk_t *pAVar7;
  Abc_Des_t *pAVar8;
  uint local_38;
  int local_34;
  int Counter;
  int i;
  Abc_Obj_t *pNet;
  Abc_Obj_t *pTerm;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pNtk_local;
  
  pNtkNew = pNtk;
  iVar2 = Abc_NtkIsNetlist(pNtk);
  if (iVar2 == 0) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                  ,0xc0,"Abc_Ntk_t *Abc_NtkFlattenLogicHierarchy2(Abc_Ntk_t *)");
  }
  pTerm = (Abc_Obj_t *)Abc_NtkAlloc(pNtkNew->ntkType,pNtkNew->ntkFunc,1);
  pAVar5 = (Abc_Obj_t *)Abc_UtilStrsav(pNtkNew->pName);
  pTerm->pNext = pAVar5;
  pcVar6 = Abc_UtilStrsav(pNtkNew->pSpec);
  *(char **)&pTerm->Id = pcVar6;
  Abc_NtkCleanCopy(pNtkNew);
  for (local_34 = 0; iVar2 = local_34, iVar3 = Abc_NtkPiNum(pNtkNew), iVar2 < iVar3;
      local_34 = local_34 + 1) {
    pNet = Abc_NtkPi(pNtkNew,local_34);
    Abc_NtkDupObj((Abc_Ntk_t *)pTerm,pNet,0);
    _Counter = Abc_ObjFanout0(pNet);
    pAVar5 = pTerm;
    pcVar6 = Abc_ObjName(_Counter);
    pAVar5 = Abc_NtkFindOrCreateNet((Abc_Ntk_t *)pAVar5,pcVar6);
    (_Counter->field_6).pCopy = pAVar5;
    Abc_ObjAddFanin((_Counter->field_6).pCopy,(pNet->field_6).pCopy);
  }
  for (local_34 = 0; iVar2 = local_34, iVar3 = Abc_NtkPoNum(pNtkNew), iVar2 < iVar3;
      local_34 = local_34 + 1) {
    pNet = Abc_NtkPo(pNtkNew,local_34);
    Abc_NtkDupObj((Abc_Ntk_t *)pTerm,pNet,0);
    _Counter = Abc_ObjFanin0(pNet);
    pAVar5 = pTerm;
    pcVar6 = Abc_ObjName(_Counter);
    pAVar5 = Abc_NtkFindOrCreateNet((Abc_Ntk_t *)pAVar5,pcVar6);
    (_Counter->field_6).pCopy = pAVar5;
    Abc_ObjAddFanin((pNet->field_6).pCopy,(_Counter->field_6).pCopy);
  }
  local_38 = 0xffffffff;
  Abc_NtkFlattenLogicHierarchy2_rec((Abc_Ntk_t *)pTerm,pNtkNew,(int *)&local_38);
  uVar1 = local_38;
  uVar4 = Abc_NtkBlackboxNum((Abc_Ntk_t *)pTerm);
  printf("Hierarchy reader flattened %d instances of logic boxes and left %d black boxes.\n",
         (ulong)uVar1,(ulong)uVar4);
  if (pNtkNew->pDesign != (Abc_Des_t *)0x0) {
    pAVar7 = (Abc_Ntk_t *)Vec_PtrEntry(pNtkNew->pDesign->vTops,0);
    if (pAVar7 != pNtkNew) {
      __assert_fail("Vec_PtrEntry(pNtk->pDesign->vTops, 0) == pNtk",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                    ,0xe3,"Abc_Ntk_t *Abc_NtkFlattenLogicHierarchy2(Abc_Ntk_t *)");
    }
    pAVar8 = Abc_DesDupBlackboxes(pNtkNew->pDesign,(Abc_Ntk_t *)pTerm);
    pTerm[2].vFanins.pArray = (int *)pAVar8;
    for (local_34 = 0; iVar2 = local_34, iVar3 = Vec_PtrSize((Vec_Ptr_t *)pTerm[1].pNext),
        iVar2 < iVar3; local_34 = local_34 + 1) {
      pNet = Abc_NtkBox((Abc_Ntk_t *)pTerm,local_34);
      iVar2 = Abc_ObjIsBlackbox(pNet);
      if (iVar2 != 0) {
        pNet->field_5 =
             *(anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *)((long)(pNet->field_5).pData + 0x160);
      }
    }
  }
  Abc_NtkOrderCisCos((Abc_Ntk_t *)pTerm);
  if (pNtkNew->pExdc != (Abc_Ntk_t *)0x0) {
    printf("EXDC is not transformed.\n");
  }
  iVar2 = Abc_NtkCheck((Abc_Ntk_t *)pTerm);
  if (iVar2 == 0) {
    fprintf(_stdout,"Abc_NtkFlattenLogicHierarchy2(): Network check has failed.\n");
    Abc_NtkDelete((Abc_Ntk_t *)pTerm);
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    pNtk_local = (Abc_Ntk_t *)pTerm;
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkFlattenLogicHierarchy2( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pTerm, * pNet;
    int i, Counter;
    extern Abc_Des_t * Abc_DesDupBlackboxes( Abc_Des_t * p, Abc_Ntk_t * pNtkSave );

    assert( Abc_NtkIsNetlist(pNtk) );
    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Abc_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Abc_UtilStrsav(pNtk->pSpec);

    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );

    // duplicate PIs/POs and their nets
    Abc_NtkForEachPi( pNtk, pTerm, i )
    {
        Abc_NtkDupObj( pNtkNew, pTerm, 0 );
        pNet = Abc_ObjFanout0( pTerm );
        pNet->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pNet) );
        Abc_ObjAddFanin( pNet->pCopy, pTerm->pCopy );
    }
    Abc_NtkForEachPo( pNtk, pTerm, i )
    {
        Abc_NtkDupObj( pNtkNew, pTerm, 0 );
        pNet = Abc_ObjFanin0( pTerm );
        pNet->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pNet) );
        Abc_ObjAddFanin( pTerm->pCopy, pNet->pCopy );
    }

    // recursively flatten hierarchy, create internal logic, add new PI/PO names if there are black boxes
    Counter = -1;
    Abc_NtkFlattenLogicHierarchy2_rec( pNtkNew, pNtk, &Counter );
    printf( "Hierarchy reader flattened %d instances of logic boxes and left %d black boxes.\n", 
        Counter, Abc_NtkBlackboxNum(pNtkNew) );

    if ( pNtk->pDesign )
    {
        // pass on the design
        assert( Vec_PtrEntry(pNtk->pDesign->vTops, 0) == pNtk );
        pNtkNew->pDesign = Abc_DesDupBlackboxes( pNtk->pDesign, pNtkNew );
        // update the pointers
        Abc_NtkForEachBlackbox( pNtkNew, pTerm, i )
            pTerm->pData = ((Abc_Ntk_t *)pTerm->pData)->pCopy;
    }

    // we may have added property outputs
    Abc_NtkOrderCisCos( pNtkNew );

    // copy the timing information
//    Abc_ManTimeDup( pNtk, pNtkNew );
    // duplicate EXDC 
    if ( pNtk->pExdc )
        printf( "EXDC is not transformed.\n" );
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        fprintf( stdout, "Abc_NtkFlattenLogicHierarchy2(): Network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}